

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

string * __thiscall
google::protobuf::StrCat_abi_cxx11_
          (string *__return_storage_ptr__,protobuf *this,AlphaNum *a,AlphaNum *b,AlphaNum *c)

{
  pointer __dest;
  LogMessage *other;
  pointer __dest_00;
  LogFinisher local_71;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  LogMessage local_68;
  
  local_70 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_70;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize
            ((ulong)__return_storage_ptr__,
             (char)a->piece_size_ + (char)*(undefined8 *)(this + 8) + (char)b->piece_size_);
  __dest = (__return_storage_ptr__->_M_dataplus)._M_p;
  __dest_00 = __dest;
  if (*(size_t *)(this + 8) != 0) {
    memcpy(__dest,*(void **)this,*(size_t *)(this + 8));
    __dest_00 = __dest + *(long *)(this + 8);
  }
  if (a->piece_size_ != 0) {
    memcpy(__dest_00,a->piece_data_,a->piece_size_);
    __dest_00 = __dest_00 + a->piece_size_;
  }
  if (b->piece_size_ != 0) {
    memcpy(__dest_00,b->piece_data_,b->piece_size_);
    __dest_00 = __dest_00 + b->piece_size_;
  }
  if (__dest_00 != __dest + __return_storage_ptr__->_M_string_length) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,"third_party/protobuf-lite/strutil.cc",0x5cf);
    other = internal::LogMessage::operator<<
                      (&local_68,"CHECK failed: (out) == (begin + result.size()): ");
    internal::LogFinisher::operator=(&local_71,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StrCat(const AlphaNum &a, const AlphaNum &b, const AlphaNum &c) {
  std::string result;
  result.resize(a.size() + b.size() + c.size());
  char *const begin = &*result.begin();
  char *out = Append2(begin, a, b);
  out = Append1(out, c);
  GOOGLE_DCHECK_EQ(out, begin + result.size());
  return result;
}